

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O2

void __thiscall tonk::gateway::StateMachine::API_Request(StateMachine *this,AppRequest *request)

{
  MappedPortLifetime *pMVar1;
  undefined2 uVar2;
  RequestType RVar3;
  pointer pAVar4;
  
  std::mutex::lock(&this->API_Lock);
  pAVar4 = (this->API_Requests).
           super__Vector_base<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pAVar4 == (this->API_Requests).
                  super__Vector_base<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::vector<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>::push_back
                (&this->API_Requests,request);
LAB_0012e0fa:
      LOCK();
      (this->API_Requests_Updated)._M_base._M_i = true;
      UNLOCK();
      pthread_mutex_unlock((pthread_mutex_t *)&this->API_Lock);
      AsioHost::DispatchTick(this->Host);
      return;
    }
    if (pAVar4->LocalPort == request->LocalPort) {
      uVar2 = *(undefined2 *)&request->field_0x2;
      RVar3 = request->Type;
      pMVar1 = request->API_LifetimePtr;
      pAVar4->LocalPort = request->LocalPort;
      *(undefined2 *)&pAVar4->field_0x2 = uVar2;
      pAVar4->Type = RVar3;
      pAVar4->API_LifetimePtr = pMVar1;
      goto LAB_0012e0fa;
    }
    pAVar4 = pAVar4 + 1;
  } while( true );
}

Assistant:

void StateMachine::API_Request(const AppRequest& request)
{
    TONK_DEBUG_ASSERT(request.LocalPort != 0);

    // This will be called from the application

    // Hold API lock while accessing the requests list
    {
        std::lock_guard<std::mutex> locker(API_Lock);

        bool found = false;
        for (auto& r : API_Requests)
        {
            // Note: Requests are uniquely identified by ports
            if (r.LocalPort == request.LocalPort)
            {
                r = request;
                found = true;
                break;
            }
        }

        if (!found) {
            API_Requests.push_back(request);
        }

        // Set the dirty flag
        API_Requests_Updated = true;
    }

    // Run OnTick() immediately
    Host->DispatchTick();
}